

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,uint64_t u64)

{
  ushort uVar1;
  
  (this->data_).s.str = (Ch *)0x0;
  (this->data_).n = (Number)u64;
  uVar1 = (ushort)((u64 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
  if (u64 >> 0x20 != 0) {
    uVar1 = (ushort)(-1 < (long)u64) << 7 | 0x116;
  }
  (this->data_).f.flags = uVar1;
  return;
}

Assistant:

explicit GenericValue(uint64_t u64) RAPIDJSON_NOEXCEPT : data_() {
        data_.n.u64 = u64;
        data_.f.flags = kNumberUint64Flag;
        if (!(u64 & RAPIDJSON_UINT64_C2(0x80000000, 0x00000000)))
            data_.f.flags |= kInt64Flag;
        if (!(u64 & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x00000000)))
            data_.f.flags |= kUintFlag;
        if (!(u64 & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
            data_.f.flags |= kIntFlag;
    }